

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fretMain.c
# Opt level: O0

void Abc_ObjPrintNeighborhood(Abc_Obj_t *pObj,int depth)

{
  int iVar1;
  Vec_Ptr_t *vNodes_00;
  void *pvVar2;
  Abc_Obj_t *pObj2;
  Vec_Ptr_t *vNodes;
  int depth_local;
  Abc_Obj_t *pObj_local;
  
  vNodes_00 = Vec_PtrAlloc(100);
  Abc_ObjPrintNeighborhood_rec(pObj,vNodes_00,depth);
  while( true ) {
    iVar1 = Vec_PtrSize(vNodes_00);
    if (iVar1 == 0) break;
    pvVar2 = Vec_PtrPop(vNodes_00);
    *(uint *)((long)pvVar2 + 0x14) = *(uint *)((long)pvVar2 + 0x14) & 0xffffffbf;
  }
  Vec_PtrFree(vNodes_00);
  return;
}

Assistant:

void Abc_ObjPrintNeighborhood( Abc_Obj_t *pObj, int depth ) {
  Vec_Ptr_t *vNodes = Vec_PtrAlloc(100); 
  Abc_Obj_t *pObj2;

  Abc_ObjPrintNeighborhood_rec( pObj, vNodes, depth );

  while(Vec_PtrSize(vNodes)) {
    pObj2 = (Abc_Obj_t*)Vec_PtrPop(vNodes);
    pObj2->fMarkC = 0;
  }

  Vec_PtrFree(vNodes);
}